

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

bool __thiscall units::precise_unit::operator==(precise_unit *this,precise_unit *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if ((other->base_units_ != this->base_units_) || (this->commodity_ != other->commodity_)) {
    return false;
  }
  dVar1 = this->multiplier_;
  dVar4 = other->multiplier_;
  if ((dVar1 != dVar4) || (NAN(dVar1) || NAN(dVar4))) {
    dVar5 = dVar1 - dVar4;
    if (((dVar5 != 0.0) || (NAN(dVar5))) &&
       ((NAN(dVar5) || (0xffffffffffffe < (long)ABS(dVar5) - 1U)))) {
      dVar5 = (double)((long)dVar1 + 0x800U & 0xfffffffffffff000);
      dVar2 = (double)((long)dVar4 + 0x800U & 0xfffffffffffff000);
      if ((dVar5 != dVar2) || (NAN(dVar5) || NAN(dVar2))) {
        dVar3 = (double)((long)(dVar4 * 1.0000000000005) + 0x800U & 0xfffffffffffff000);
        if ((dVar3 != dVar5) || (NAN(dVar3) || NAN(dVar5))) {
          dVar4 = (double)((long)(dVar4 * 0.9999999999995) + 0x800U & 0xfffffffffffff000);
          if ((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) {
            dVar4 = (double)((long)(dVar1 * 1.0000000000005) + 0x800U & 0xfffffffffffff000);
            if ((dVar4 != dVar2) || (NAN(dVar4) || NAN(dVar2))) {
              return (bool)(-((double)((long)(dVar1 * 0.9999999999995) + 0x800U & 0xfffffffffffff000
                                      ) == dVar2) & 1);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

constexpr bool equivalent_non_counting(const unit_data& other) const
        {
            return meter_ == other.meter_ && second_ == other.second_ &&
                kilogram_ == other.kilogram_ && ampere_ == other.ampere_ &&
                candela_ == other.candela_ && kelvin_ == other.kelvin_ &&
                currency_ == other.currency_;
        }